

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O0

void basisu::gaussian_filter
               (imagef *dst,imagef *orig_img,uint32_t odd_filter_width,float sigma_sqr,bool wrapping
               ,uint32_t width_divisor,uint32_t height_divisor)

{
  float fVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  float *pfVar5;
  uint in_EDX;
  imagef *in_RSI;
  uint in_R8D;
  uint in_R9D;
  float fVar6;
  float w;
  vec4F *p;
  int x;
  int xd;
  int y;
  int yd;
  vec4F c;
  int ox;
  int oy;
  int L;
  int H;
  int dst_height;
  int dst_width;
  vector2D<float> kernel;
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  vec<4U,_float> *in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  imagef *in_stack_fffffffffffffeb0;
  uint32_t in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  vector2D<float> *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  float *in_stack_fffffffffffffee0;
  vec4F *in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int local_90;
  int local_88;
  int local_74;
  int local_70;
  
  if (in_EDX == 0 || (in_EDX & 1) == 0) {
    __assert_fail("odd_filter_width && (odd_filter_width & 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_ssim.cpp"
                  ,0x5e,
                  "void basisu::gaussian_filter(imagef &, const imagef &, uint32_t, float, bool, uint32_t, uint32_t)"
                 );
  }
  vector2D<float>::vector2D
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
  vector2D<float>::get_ptr((vector2D<float> *)0x526d55);
  compute_gaussian_kernel
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
             (float)((ulong)in_stack_fffffffffffffed0 >> 0x20),(uint32_t)in_stack_fffffffffffffed0);
  uVar2 = imagef::get_width(in_RSI);
  uVar3 = imagef::get_height(in_RSI);
  uVar4 = in_EDX >> 1;
  vec<4U,_float>::vec(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                      0.0,7.570079e-39);
  imagef::crop((imagef *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (uint32_t)((ulong)in_stack_ffffffffffffff00 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
               in_stack_fffffffffffffef0);
  for (local_70 = 0; local_70 < (int)(uVar3 / in_R9D); local_70 = local_70 + 1) {
    for (local_74 = 0; local_74 < (int)(uVar2 / in_R8D); local_74 = local_74 + 1) {
      vec<4U,_float>::vec(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      for (local_88 = -uVar4; local_90 = -uVar4, local_88 <= (int)uVar4; local_88 = local_88 + 1) {
        for (; local_90 <= (int)uVar4; local_90 = local_90 + 1) {
          imagef::get_clamped_or_wrapped
                    (in_stack_fffffffffffffeb0,(int)in_stack_fffffffffffffeac,
                     (int)in_stack_fffffffffffffea8,
                     SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffea0 >> 0x30,0));
          pfVar5 = vector2D<float>::operator()
                             ((vector2D<float> *)in_stack_fffffffffffffeb0,
                              (uint32_t)in_stack_fffffffffffffeac,
                              (uint32_t)in_stack_fffffffffffffea8);
          fVar1 = *pfVar5;
          fVar6 = vec<4U,_float>::operator[]
                            (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
          fVar6 = fVar6 * fVar1;
          pfVar5 = vec<4U,_float>::operator[]
                             (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
          *pfVar5 = *pfVar5 + fVar6;
          fVar6 = vec<4U,_float>::operator[]
                            (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
          fVar6 = fVar6 * fVar1;
          pfVar5 = vec<4U,_float>::operator[]
                             (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
          *pfVar5 = *pfVar5 + fVar6;
          fVar6 = vec<4U,_float>::operator[]
                            (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
          pfVar5 = vec<4U,_float>::operator[]
                             (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
          *pfVar5 = *pfVar5 + fVar6 * fVar1;
          fVar6 = vec<4U,_float>::operator[]
                            (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
          fVar6 = fVar6 * fVar1;
          pfVar5 = vec<4U,_float>::operator[]
                             (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
          *pfVar5 = fVar6 + *pfVar5;
        }
      }
      imagef::operator()(in_stack_fffffffffffffeb0,(uint32_t)in_stack_fffffffffffffeac,
                         (uint32_t)in_stack_fffffffffffffea8);
      vec<4U,_float>::operator[](in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
      pfVar5 = vec<4U,_float>::operator[]
                         (in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c);
      in_stack_fffffffffffffeac = *pfVar5;
      in_stack_fffffffffffffeb0 =
           (imagef *)
           vec<4U,_float>::operator[](in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c)
      ;
      in_stack_fffffffffffffe9c = (float)in_stack_fffffffffffffeb0->m_width;
      in_stack_fffffffffffffea0 =
           (vec<4U,_float> *)
           vec<4U,_float>::operator[](in_stack_fffffffffffffea0,(uint32_t)in_stack_fffffffffffffe9c)
      ;
      vec<4U,_float>::set((vec<4U,_float> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                          in_stack_fffffffffffffea8,
                          (float)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                          SUB84(in_stack_fffffffffffffea0,0));
    }
  }
  vector2D<float>::~vector2D((vector2D<float> *)0x5272d4);
  return;
}

Assistant:

void gaussian_filter(imagef &dst, const imagef &orig_img, uint32_t odd_filter_width, float sigma_sqr, bool wrapping, uint32_t width_divisor, uint32_t height_divisor)
	{
		assert(odd_filter_width && (odd_filter_width & 1));
		odd_filter_width |= 1;

		vector2D<float> kernel(odd_filter_width, odd_filter_width);
		compute_gaussian_kernel(kernel.get_ptr(), odd_filter_width, odd_filter_width, sigma_sqr, cComputeGaussianFlagNormalize);

		const int dst_width = orig_img.get_width() / width_divisor;
		const int dst_height = orig_img.get_height() / height_divisor;

		const int H = odd_filter_width / 2;
		const int L = -H;

		dst.crop(dst_width, dst_height);

//#pragma omp parallel for
		for (int oy = 0; oy < dst_height; oy++)
		{
			for (int ox = 0; ox < dst_width; ox++)
			{
				vec4F c(0.0f);

				for (int yd = L; yd <= H; yd++)
				{
					int y = oy * height_divisor + (height_divisor >> 1) + yd;

					for (int xd = L; xd <= H; xd++)
					{
						int x = ox * width_divisor + (width_divisor >> 1) + xd;

						const vec4F &p = orig_img.get_clamped_or_wrapped(x, y, wrapping, wrapping);

						float w = kernel(xd + H, yd + H);
						c[0] += p[0] * w;
						c[1] += p[1] * w;
						c[2] += p[2] * w;
						c[3] += p[3] * w;
					}
				}

				dst(ox, oy).set(c[0], c[1], c[2], c[3]);
			}
		}
	}